

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O3

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (MultiFab *mf,IntVect *nghost,Real time,MultiFab *cmf,int scomp,int dcomp,int ncomp,
          Geometry *cgeom,Geometry *fgeom,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *cbc,
          int cbccomp,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *fbc,
          int fbccomp,IntVect *ratio,InterpBase *mapper,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          )

{
  int *piVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  DistributionMapping *dm;
  int i;
  BATType BVar7;
  IndexSpace *pIVar8;
  uint uVar9;
  long lVar10;
  undefined4 uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  IndexType IVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  initializer_list<int> __l;
  allocator_type local_301;
  int local_300;
  int local_2fc;
  Box bx;
  Periodicity local_2d8;
  DistributionMapping *local_2c8;
  Real local_2c0;
  MFIter mfi;
  IntVect local_248;
  InterpolaterBoxCoarsener local_238;
  BoxArray ba_crse_patch;
  MultiFab mf_crse_patch;
  
  local_2c0 = time;
  InterpBase::BoxCoarsener(mapper,ratio);
  BVar7 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type;
  uVar16 = 0;
  switch(BVar7) {
  case indexType:
  case indexType_coarsenRatio:
    uVar16 = *(uint *)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op
    ;
    uVar12 = uVar16;
    break;
  default:
    uVar16 = *(uint *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                              m_bat.m_op + 4);
  case null:
  case coarsenRatio:
    uVar12 = 0;
    if ((BVar7 != null) && (BVar7 != coarsenRatio)) {
      if (BVar7 == indexType) {
        uVar12 = *(uint *)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                           m_op;
      }
      else {
        uVar12 = *(uint *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray
                                  .m_bat.m_op + 4);
      }
    }
  }
  local_2c8 = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  uVar3 = *(undefined8 *)((fgeom->domain).smallend.vect + 2);
  uVar4 = *(undefined8 *)((fgeom->domain).bigend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fgeom->domain).bigend.vect >> 0x20);
  bx.bigend.vect[2] = (int)uVar4;
  bx.btype.itype = SUB84(uVar4,4);
  uVar6 = bx._20_8_;
  bx.smallend.vect._0_8_ = *(undefined8 *)(fgeom->domain).smallend.vect;
  bx.smallend.vect[2] = (int)uVar3;
  bx.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  lVar10 = 0;
  bx.btype.itype = SUB84(uVar4,4);
  IVar15.itype = bx.btype.itype;
  bx._20_8_ = uVar6;
  do {
    uVar14 = 1 << ((byte)lVar10 & 0x1f);
    uVar9 = (uint)lVar10;
    bx.bigend.vect[lVar10] =
         (bx.bigend.vect[lVar10] + (uint)((uVar12 >> (uVar9 & 0x1f) & 1) != 0)) -
         (uint)((IVar15.itype >> (uVar9 & 0x1f) & 1) != 0);
    if ((uVar12 >> (uVar9 & 0x1f) & 1) == 0) {
      IVar15.itype = ~uVar14 & bx.btype.itype;
    }
    else {
      IVar15.itype = uVar14 | bx.btype.itype;
    }
    bx.btype.itype = IVar15.itype;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    if (*(char *)((long)(fgeom->super_CoordSys).inv_dx + lVar10 + 0x19) == '\x01') {
      iVar17 = nghost->vect[lVar10];
      piVar1 = bx.smallend.vect + lVar10;
      *piVar1 = *piVar1 - iVar17;
      piVar1 = bx.bigend.vect + lVar10;
      *piVar1 = *piVar1 + iVar17;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  peVar2 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_300 = dcomp;
  local_2fc = ncomp;
  BoxArray::BoxArray(&ba_crse_patch,
                     ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      *(long *)&(peVar2->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7);
  peVar2 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar12 = (int)((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data >> 2) * -0x49249249;
  if (0 < (int)uVar12) {
    uVar13 = 0;
    do {
      BATransformer::operator()
                ((Box *)&mfi,
                 &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat,
                 (Box *)(uVar13 * 0x1c +
                        *(long *)&(((mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                    boxarray.m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      iVar19 = (int)*(undefined8 *)nghost->vect;
      iVar17 = (int)mfi.m_fa._M_t.
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl - iVar19;
      iVar20 = (int)((ulong)*(undefined8 *)nghost->vect >> 0x20);
      iVar18 = mfi.m_fa._M_t.
               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ - iVar20;
      BVar7 = (int)mfi.fabArray - nghost->vect[2];
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_8_ =
           CONCAT44(mfi.tile_size.vect[0] + iVar20,mfi.fabArray._4_4_ + iVar19);
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[0] = nghost->vect[2] + mfi.tile_size.vect[1];
      lVar10 = 0;
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[1] = mfi.tile_size.vect[2];
      do {
        uVar14 = 1 << ((byte)lVar10 & 0x1f);
        uVar9 = (uint)lVar10;
        *(uint *)((long)&mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op + lVar10 * 4) =
             (*(int *)((long)&mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                              boxarray.m_bat.m_op + lVar10 * 4) +
             (uint)((uVar16 >> (uVar9 & 0x1f) & 1) != 0)) -
             (uint)(((uint)mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                           boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] >> (uVar9 & 0x1f) & 1
                    ) != 0);
        if ((uVar16 >> (uVar9 & 0x1f) & 1) == 0) {
          mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_crse_ratio.vect[1] =
               ~uVar14 & mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        }
        else {
          mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_crse_ratio.vect[1] =
               uVar14 | mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                        m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      uVar21 = CONCAT44(-(uint)(bx.smallend.vect[1] < iVar18),-(uint)(bx.smallend.vect[0] < iVar17))
      ;
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
           (_func_int **)(~uVar21 & bx.smallend.vect._0_8_ | CONCAT44(iVar18,iVar17) & uVar21);
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
           bx.smallend.vect[2];
      if (bx.smallend.vect[2] < (int)BVar7) {
        mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type
             = BVar7;
      }
      uVar21 = CONCAT44(-(uint)((int)((ulong)mf_crse_patch.super_FabArray<amrex::FArrayBox>.
                                             super_FabArrayBase.boxarray.m_bat.m_op._0_8_ >> 0x20) <
                               bx.bigend.vect[1]),
                        -(uint)((int)mf_crse_patch.super_FabArray<amrex::FArrayBox>.
                                     super_FabArrayBase.boxarray.m_bat.m_op._0_8_ <
                               bx.bigend.vect[0]));
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_8_ =
           ~uVar21 & CONCAT44(bx.bigend.vect[1],bx.bigend.vect[0]) |
           mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           _0_8_ & uVar21;
      uVar11 = bx.bigend.vect[2];
      if (mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_crse_ratio.vect[0] < bx.bigend.vect[2]) {
        uVar11 = mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                 m_op.m_bndryReg.m_crse_ratio.vect[0];
      }
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[0] = uVar11;
      InterpolaterBoxCoarsener::doit((Box *)&mfi,&local_238,(Box *)&mf_crse_patch);
      BoxArray::set(&ba_crse_patch,(int)uVar13,(Box *)&mfi);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar12 & 0x7fffffff));
  }
  MultiFab::MultiFab(&mf_crse_patch);
  pIVar8 = EB2::TopIndexSpaceIfPresent();
  iVar17 = local_2fc;
  if (pIVar8 == (IndexSpace *)0x0) {
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    mfi.fabArray = (FabArrayBase *)0x0;
    mfi.tile_size.vect[0] = 0;
    mfi.tile_size.vect[1] = 0;
    mfi.tile_size.vect[2] = 0;
    mfi.flags = '\0';
    mfi._29_3_ = 0;
    mfi.currentIndex = 0;
    mfi.beginIndex = 0;
    local_248.vect._0_8_ = &PTR__FabFactory_0080b918;
    MultiFab::define(&mf_crse_patch,&ba_crse_patch,local_2c8,local_2fc,0,(MFInfo *)&mfi,
                     (FabFactory<amrex::FArrayBox> *)&local_248);
    iVar18 = local_300;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi.tile_size);
  }
  else {
    local_248.vect._0_8_ = (undefined **)0x0;
    local_248.vect[2] = 0;
    __l._M_len = 3;
    __l._M_array = local_248.vect;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&mfi,__l,&local_301);
    dm = local_2c8;
    iVar17 = local_2fc;
    iVar18 = local_300;
    makeEBFabFactory((amrex *)&local_2d8,cgeom,&ba_crse_patch,local_2c8,
                     (Vector<int,_std::allocator<int>_> *)&mfi,basic);
    if ((__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0) {
      operator_delete((void *)mfi.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                      mfi.tile_size.vect._0_8_ -
                      (long)mfi.m_fa._M_t.
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl);
    }
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    mfi.fabArray = (FabArrayBase *)0x0;
    mfi.tile_size.vect[0] = 0;
    mfi.tile_size.vect[1] = 0;
    mfi.tile_size.vect[2] = 0;
    mfi.flags = '\0';
    mfi._29_3_ = 0;
    mfi.currentIndex = 0;
    mfi.beginIndex = 0;
    MultiFab::define(&mf_crse_patch,&ba_crse_patch,dm,iVar17,0,(MFInfo *)&mfi,
                     (FabFactory<amrex::FArrayBox> *)local_2d8.period.vect._0_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi.tile_size);
    if ((FabFactory<amrex::FArrayBox> *)local_2d8.period.vect._0_8_ !=
        (FabFactory<amrex::FArrayBox> *)0x0) {
      (*(*(_func_int ***)local_2d8.period.vect._0_8_)[1])();
    }
  }
  FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
            (&mf_crse_patch.super_FabArray<amrex::FArrayBox>,NAN,0,
             mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,cgeom);
  local_2d8 = Geometry::periodicity(cgeom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  auVar5._12_4_ = 0;
  auVar5._0_12_ = (undefined1  [12])mfi._12_12_;
  mfi._8_16_ = auVar5 << 0x20;
  local_248.vect[0] = 0;
  local_248.vect[1] = 0;
  local_248.vect[2] = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&mf_crse_patch.super_FabArray<amrex::FArrayBox>,&cmf->super_FabArray<amrex::FArrayBox>,
             scomp,0,iVar17,(IntVect *)&mfi,&local_248,&local_2d8,COPY,(CPC *)0x0,false);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect._0_8_;
  mfi.fabArray._0_4_ =
       mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[2];
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            (cbc,&mf_crse_patch,0,iVar17,(IntVect *)&mfi,local_2c0,cbccomp);
  MFIter::MFIter(&mfi,(FabArrayBase *)&mf_crse_patch,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  FillPatchInterp<amrex::MultiFab>
            (mf,iVar18,&mf_crse_patch,0,iVar17,nghost,cgeom,fgeom,&bx,ratio,mapper,bcs,bcscomp);
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            (fbc,mf,iVar18,iVar17,nghost,local_2c0,fbccomp);
  MultiFab::~MultiFab(&mf_crse_patch);
  BoxArray::~BoxArray(&ba_crse_patch);
  InterpolaterBoxCoarsener::~InterpolaterBoxCoarsener(&local_238);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
InterpFromCoarseLevel (MF& mf, IntVect const& nghost, Real time,
                       const MF& cmf, int scomp, int dcomp, int ncomp,
                       const Geometry& cgeom, const Geometry& fgeom,
                       BC& cbc, int cbccomp,
                       BC& fbc, int fbccomp,
                       const IntVect& ratio,
                       Interp* mapper,
                       const Vector<BCRec>& bcs, int bcscomp,
                       const PreInterpHook& pre_interp,
                       const PostInterpHook& post_interp)
{
    using FAB = typename MF::FABType::value_type;

    const InterpolaterBoxCoarsener& coarsener = mapper->BoxCoarsener(ratio);

    const BoxArray& ba = mf.boxArray();
    const DistributionMapping& dm = mf.DistributionMap();

    const IndexType& typ = ba.ixType();

    BL_ASSERT(typ == cmf.boxArray().ixType());

    Box fdomain_g( amrex::convert(fgeom.Domain(),mf.ixType()) );
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            fdomain_g.grow(i,nghost[i]);
        }
    }

    BoxArray ba_crse_patch(ba.size());
    {  // TODO: later we might want to cache this
        for (int i = 0, N = ba.size(); i < N; ++i)
        {
            Box bx = amrex::convert(amrex::grow(ba[i],nghost), typ);
            bx &= fdomain_g;
            ba_crse_patch.set(i, coarsener.doit(bx));
        }
    }

    MF mf_crse_patch;
#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        auto factory = makeEBFabFactory(cgeom, ba_crse_patch, dm, {0,0,0}, EBSupport::basic);
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0, MFInfo(), *factory);
    } else
#endif
    {
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0);
    }
    mf_set_domain_bndry (mf_crse_patch, cgeom);

    mf_crse_patch.ParallelCopy(cmf, scomp, 0, ncomp, cgeom.periodicity());

    cbc(mf_crse_patch, 0, ncomp, mf_crse_patch.nGrowVect(), time, cbccomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_crse_patch); mfi.isValid(); ++mfi)
    {
        FAB& sfab   = mf_crse_patch[mfi];
        pre_interp(sfab, sfab.box(), 0, ncomp);
    }

    FillPatchInterp(mf, dcomp, mf_crse_patch, 0, ncomp, nghost, cgeom, fgeom, fdomain_g,
                    ratio, mapper, bcs, bcscomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        FAB& dfab   = mf[mfi];
        Box dfab_bx = dfab.box();
        dfab_bx.grow(nghost-mf.nGrowVect());
        const Box& dbx = dfab_bx & fdomain_g;

        post_interp(dfab, dbx, dcomp, ncomp);
    }

    fbc(mf, dcomp, ncomp, nghost, time, fbccomp);
}